

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O2

int zoh_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double local_38;
  
  lVar8 = data->input_frames;
  if (0 < lVar8) {
    pvVar2 = psrc->private_data;
    if (pvVar2 == (void *)0x0) {
      return 5;
    }
    uVar10 = *(uint *)((long)pvVar2 + 4);
    if (*(int *)((long)pvVar2 + 8) != 0) {
      uVar4 = 0;
      uVar6 = 0;
      if (0 < (int)uVar10) {
        uVar6 = (ulong)uVar10;
      }
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        *(float *)((long)pvVar2 + uVar4 * 4 + 0x30) = data->data_in[uVar4];
      }
      *(undefined4 *)((long)pvVar2 + 8) = 0;
    }
    lVar8 = lVar8 * (int)uVar10;
    *(long *)((long)pvVar2 + 0x10) = lVar8;
    lVar7 = data->output_frames * (long)(int)uVar10;
    *(long *)((long)pvVar2 + 0x20) = lVar7;
    *(undefined8 *)((long)pvVar2 + 0x28) = 0;
    *(undefined8 *)((long)pvVar2 + 0x18) = 0;
    dVar13 = psrc->last_ratio;
    if (dVar13 < 0.00390625) {
      return 0x16;
    }
    if (256.0 < dVar13) {
      return 0x16;
    }
    dVar12 = psrc->last_position;
    uVar6 = 0;
    local_38 = dVar13;
    uVar4 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar4 = uVar6;
    }
    while (((dVar12 < 1.0 && ((long)uVar6 < lVar7)) &&
           ((double)(int)uVar10 * dVar12 + 0.0 < (double)lVar8))) {
      if ((0 < lVar7) && (1e-20 < ABS(dVar13 - data->src_ratio))) {
        local_38 = ((data->src_ratio - dVar13) * (double)(long)uVar6) / (double)lVar7 + dVar13;
      }
      for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
        data->data_out[uVar6] = *(float *)((long)pvVar2 + uVar9 * 4 + 0x30);
        uVar6 = uVar6 + 1;
        *(ulong *)((long)pvVar2 + 0x28) = uVar6;
      }
      dVar12 = dVar12 + 1.0 / local_38;
    }
    while( true ) {
      dVar13 = fmod_one(dVar12);
      iVar1 = *(int *)((long)pvVar2 + 4);
      lVar8 = lrint(dVar12 - dVar13);
      lVar5 = lVar8 * iVar1 + *(long *)((long)pvVar2 + 0x18);
      *(long *)((long)pvVar2 + 0x18) = lVar5;
      lVar8 = *(long *)((long)pvVar2 + 0x28);
      lVar7 = *(long *)((long)pvVar2 + 0x10);
      lVar3 = *(long *)((long)pvVar2 + 0x20);
      if (lVar3 <= lVar8) break;
      uVar10 = *(uint *)((long)pvVar2 + 4);
      if ((double)lVar7 < (double)(int)uVar10 * dVar13 + (double)lVar5) break;
      if (0 < lVar3) {
        dVar12 = psrc->last_ratio;
        if (1e-20 < ABS(dVar12 - data->src_ratio)) {
          local_38 = ((data->src_ratio - dVar12) * (double)lVar8) / (double)lVar3 + dVar12;
        }
      }
      lVar5 = lVar5 - (int)uVar10;
      uVar4 = 0;
      if (0 < (int)uVar10) {
        uVar4 = (ulong)uVar10;
      }
      while( true ) {
        bVar11 = uVar4 == 0;
        uVar4 = uVar4 - 1;
        if (bVar11) break;
        data->data_out[lVar8] = data->data_in[lVar5];
        *(long *)((long)pvVar2 + 0x28) = lVar8 + 1;
        lVar5 = lVar5 + 1;
        lVar8 = lVar8 + 1;
      }
      dVar12 = dVar13 + 1.0 / local_38;
    }
    if (lVar5 - lVar7 == 0 || lVar5 < lVar7) {
      uVar10 = *(uint *)((long)pvVar2 + 4);
    }
    else {
      uVar10 = *(uint *)((long)pvVar2 + 4);
      dVar13 = dVar13 + (double)((lVar5 - lVar7) / (long)(int)uVar10);
      *(long *)((long)pvVar2 + 0x18) = lVar7;
      lVar5 = lVar7;
    }
    psrc->last_position = dVar13;
    lVar7 = (long)(int)uVar10;
    if (0 < lVar5) {
      uVar4 = 0;
      uVar6 = 0;
      if (0 < (int)uVar10) {
        uVar6 = (ulong)uVar10;
      }
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        *(float *)((long)pvVar2 + uVar4 * 4 + 0x30) = data->data_in[(lVar5 + uVar4) - lVar7];
      }
    }
    psrc->last_ratio = local_38;
    data->input_frames_used = lVar5 / lVar7;
    data->output_frames_gen = lVar8 / lVar7;
  }
  return 0;
}

Assistant:

static int
zoh_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	ZOH_DATA 	*priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (ZOH_DATA*) psrc->private_data ;

	if (priv->reset)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->reset = 0 ;
		} ;

	priv->in_count = data->input_frames * priv->channels ;
	priv->out_count = data->output_frames * priv->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = psrc->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + priv->channels * input_index >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = priv->last_value [ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += priv->channels * lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + priv->channels * input_index <= priv->in_count)
	{
		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = data->data_in [priv->in_used - priv->channels + ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += priv->channels * lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / priv->channels ;
		priv->in_used = priv->in_count ;
		} ;

	psrc->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - priv->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / priv->channels ;
	data->output_frames_gen = priv->out_gen / priv->channels ;

	return SRC_ERR_NO_ERROR ;
}